

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Substitution(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  double dVar1;
  int64_t j;
  double dVar2;
  double dVar3;
  int64_t col;
  double dVar4;
  double dVar5;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_108;
  FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> local_f8
  ;
  Fad<double> local_e8;
  Fad<double> local_c8;
  undefined1 local_a8 [32];
  double local_88;
  undefined8 uStack_80;
  Fad<double> local_70;
  Fad<double> local_50;
  
  dVar1 = (double)(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  dVar4 = (double)(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (dVar1 != (double)(this->super_TPZBaseMatrix).fRow) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  dVar3 = 0.0;
  if ((long)dVar4 < 1) {
    dVar4 = dVar3;
  }
  local_88 = 0.0;
  if (0 < (long)dVar1) {
    local_88 = dVar1;
  }
  for (; dVar3 != local_88; dVar3 = (double)((long)dVar3 + 1)) {
    for (dVar5 = 0.0; dVar5 != dVar4; dVar5 = (double)((long)dVar5 + 1)) {
      for (dVar2 = 0.0; dVar3 != dVar2; dVar2 = (double)((long)dVar2 + 1)) {
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_c8,B,dVar3,dVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_e8,this,dVar3,dVar2);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])((Fad<double> *)local_a8,B,dVar2,dVar5);
        local_108.fadexpr_.left_ = &local_e8;
        local_f8.fadexpr_.left_ = &local_c8;
        local_f8.fadexpr_.right_ = &local_108;
        local_108.fadexpr_.right_ = (Fad<double> *)local_a8;
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (&local_70,&local_f8);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,dVar3,dVar5,&local_70);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad((Fad<double> *)local_a8);
        Fad<double>::~Fad(&local_e8);
        Fad<double>::~Fad(&local_c8);
      }
    }
  }
  for (dVar3 = 0.0; dVar5 = dVar1, dVar3 != dVar4; dVar3 = (double)((long)dVar3 + 1)) {
    while (0 < (long)dVar5) {
      dVar2 = (double)((long)dVar5 + -1);
      for (; (long)dVar5 < (long)dVar1; dVar5 = (double)((long)dVar5 + 1)) {
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_c8,B,dVar2,dVar3);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_e8,this,dVar2,dVar5);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])((Fad<double> *)local_a8,B,dVar5,dVar3);
        local_108.fadexpr_.left_ = &local_e8;
        local_f8.fadexpr_.left_ = &local_c8;
        local_f8.fadexpr_.right_ = &local_108;
        local_108.fadexpr_.right_ = (Fad<double> *)local_a8;
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (&local_70,&local_f8);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,dVar2,dVar3,&local_70);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad((Fad<double> *)local_a8);
        Fad<double>::~Fad(&local_e8);
        Fad<double>::~Fad(&local_c8);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,dVar2,dVar2);
      local_88 = ABS(local_50.val_);
      uStack_80 = 0;
      Fad<double>::~Fad(&local_50);
      if (local_88 < 1e-12) {
        Error("BackSub( SubstitutionLU ) <Matrix is singular",(char *)0x0);
      }
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_c8,B,dVar2,dVar3);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_e8,this,dVar2,dVar2);
      local_a8._0_8_ = &local_c8;
      local_a8._8_8_ = &local_e8;
      Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                (&local_70,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_a8);
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(B,dVar2,dVar3,&local_70);
      Fad<double>::~Fad(&local_70);
      Fad<double>::~Fad(&local_e8);
      Fad<double>::~Fad(&local_c8);
      dVar5 = dVar2;
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const{
	
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != Rows() )
		Error( "SubstitutionLU <incompatible dimensions>" );
	int64_t i;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ ) {
            for ( int64_t j = 0; j < i; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col)-GetVal(i, j) * B->GetVal(j, col) );
            }
        }
    }
    for (int64_t col=0; col<colb; col++) {
        for ( i = rowb-1; i >= 0; i-- ) {
            for ( int64_t j = i+1; j < rowb ; j++ ) {
                B->PutVal( i, col, B->GetVal(i, col) -
						  GetVal(i, j) * B->GetVal(j, col) );
            }
            if ( IsZero( GetVal(i, i) ) ) {
				Error( "BackSub( SubstitutionLU ) <Matrix is singular" );
            }
            B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
		}
    }
    return( 1 );
}